

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall
Js::JavascriptLibrary::SetDispatchProfile
          (JavascriptLibrary *this,bool fSet,JavascriptMethod dispatchInvoke)

{
  ScriptContext *pSVar1;
  HostScriptContext *pHVar2;
  DynamicType *pDVar3;
  JavascriptMethod dispatchInvoke_local;
  bool fSet_local;
  JavascriptLibrary *this_local;
  
  if (fSet) {
    this->inDispatchProfileMode = true;
    if (dispatchInvoke != (JavascriptMethod)0x0) {
      pSVar1 = GetScriptContext(this);
      pHVar2 = ScriptContext::GetHostScriptContext(pSVar1);
      (*pHVar2->_vptr_HostScriptContext[0x10])(pHVar2,dispatchInvoke);
    }
    pDVar3 = Memory::WriteBarrierPtr<Js::DynamicType>::operator->
                       (&this->idMappedFunctionWithPrototypeType);
    DynamicType::SetEntryPoint(pDVar3,ScriptContext::DebugProfileProbeThunk);
    pDVar3 = Memory::WriteBarrierPtr<Js::DynamicType>::operator->
                       (&this->externalFunctionWithDeferredPrototypeType);
    DynamicType::SetEntryPoint(pDVar3,ScriptContext::DebugProfileProbeThunk);
    pDVar3 = Memory::WriteBarrierPtr<Js::DynamicType>::operator->
                       (&this->stdCallFunctionWithDeferredPrototypeType);
    DynamicType::SetEntryPoint(pDVar3,ScriptContext::DebugProfileProbeThunk);
  }
  else {
    this->inDispatchProfileMode = false;
    if (dispatchInvoke != (JavascriptMethod)0x0) {
      pSVar1 = GetScriptContext(this);
      pHVar2 = ScriptContext::GetHostScriptContext(pSVar1);
      (*pHVar2->_vptr_HostScriptContext[0x10])(pHVar2,dispatchInvoke);
    }
    pDVar3 = Memory::WriteBarrierPtr<Js::DynamicType>::operator->
                       (&this->idMappedFunctionWithPrototypeType);
    DynamicType::SetEntryPoint(pDVar3,JavascriptExternalFunction::ExternalFunctionThunk);
    pDVar3 = Memory::WriteBarrierPtr<Js::DynamicType>::operator->
                       (&this->externalFunctionWithDeferredPrototypeType);
    DynamicType::SetEntryPoint(pDVar3,JavascriptExternalFunction::ExternalFunctionThunk);
    pDVar3 = Memory::WriteBarrierPtr<Js::DynamicType>::operator->
                       (&this->stdCallFunctionWithDeferredPrototypeType);
    DynamicType::SetEntryPoint(pDVar3,JavascriptExternalFunction::StdCallExternalFunctionThunk);
  }
  return;
}

Assistant:

void JavascriptLibrary::SetDispatchProfile(bool fSet, JavascriptMethod dispatchInvoke)
    {
        if (!fSet)
        {
            this->inDispatchProfileMode = false;
            if (dispatchInvoke != nullptr)
            {
                this->GetScriptContext()->GetHostScriptContext()->SetDispatchInvoke(dispatchInvoke);
            }
            idMappedFunctionWithPrototypeType->SetEntryPoint(JavascriptExternalFunction::ExternalFunctionThunk);
            externalFunctionWithDeferredPrototypeType->SetEntryPoint(JavascriptExternalFunction::ExternalFunctionThunk);
            stdCallFunctionWithDeferredPrototypeType->SetEntryPoint(JavascriptExternalFunction::StdCallExternalFunctionThunk);
        }
        else
        {
            this->inDispatchProfileMode = true;
            if (dispatchInvoke != nullptr)
            {
                this->GetScriptContext()->GetHostScriptContext()->SetDispatchInvoke(dispatchInvoke);
            }
            idMappedFunctionWithPrototypeType->SetEntryPoint(ProfileEntryThunk);
            externalFunctionWithDeferredPrototypeType->SetEntryPoint(ProfileEntryThunk);
            stdCallFunctionWithDeferredPrototypeType->SetEntryPoint(ProfileEntryThunk);
        }
    }